

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

SharedNumberFormat * __thiscall
icu_63::LocaleCacheKey<icu_63::SharedNumberFormat>::createObject
          (LocaleCacheKey<icu_63::SharedNumberFormat> *this,void *param_1,UErrorCode *status)

{
  UBool UVar1;
  NumberFormat *pNVar2;
  LocaleCacheKey<icu_63::SharedNumberFormat> *this_00;
  size_t size;
  LocaleCacheKey<icu_63::SharedNumberFormat> *local_158;
  SharedNumberFormat *result;
  Locale local_118;
  NumberFormat *local_38;
  NumberFormat *nf;
  char *localeId;
  UErrorCode *status_local;
  void *param_1_local;
  LocaleCacheKey<icu_63::SharedNumberFormat> *this_local;
  
  localeId = (char *)status;
  status_local = (UErrorCode *)param_1;
  param_1_local = this;
  nf = (NumberFormat *)Locale::getName(&this->fLoc);
  Locale::Locale(&local_118,(char *)nf,(char *)0x0,(char *)0x0,(char *)0x0);
  size = 1;
  pNVar2 = NumberFormat::internalCreateInstance(&local_118,UNUM_DECIMAL,(UErrorCode *)localeId);
  Locale::~Locale(&local_118);
  local_38 = pNVar2;
  UVar1 = ::U_FAILURE(*(UErrorCode *)localeId);
  if (UVar1 == '\0') {
    this_00 = (LocaleCacheKey<icu_63::SharedNumberFormat> *)
              UMemory::operator_new((UMemory *)0x20,size);
    local_158 = (LocaleCacheKey<icu_63::SharedNumberFormat> *)0x0;
    if (this_00 != (LocaleCacheKey<icu_63::SharedNumberFormat> *)0x0) {
      SharedNumberFormat::SharedNumberFormat((SharedNumberFormat *)this_00,local_38);
      local_158 = this_00;
    }
    if (local_158 == (LocaleCacheKey<icu_63::SharedNumberFormat> *)0x0) {
      localeId[0] = '\a';
      localeId[1] = '\0';
      localeId[2] = '\0';
      localeId[3] = '\0';
      if (local_38 != (NumberFormat *)0x0) {
        (*(local_38->super_Format).super_UObject._vptr_UObject[1])();
      }
      this_local = (LocaleCacheKey<icu_63::SharedNumberFormat> *)0x0;
    }
    else {
      SharedObject::addRef((SharedObject *)local_158);
      this_local = local_158;
    }
  }
  else {
    this_local = (LocaleCacheKey<icu_63::SharedNumberFormat> *)0x0;
  }
  return (SharedNumberFormat *)this_local;
}

Assistant:

U_I18N_API
const SharedNumberFormat *LocaleCacheKey<SharedNumberFormat>::createObject(
        const void * /*unused*/, UErrorCode &status) const {
    const char *localeId = fLoc.getName();
    NumberFormat *nf = NumberFormat::internalCreateInstance(
            localeId, UNUM_DECIMAL, status);
    if (U_FAILURE(status)) {
        return NULL;
    }
    SharedNumberFormat *result = new SharedNumberFormat(nf);
    if (result == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        delete nf;
        return NULL;
    }
    result->addRef();
    return result;
}